

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall
ON_PolyCurve::Evaluate
          (ON_PolyCurve *this,double t,int der_count,int v_stride,double *v,int side,int *hint)

{
  ON_Curve *pOVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  uint hint_00;
  double *pdVar5;
  double *knot;
  int iVar6;
  ulong uVar7;
  uint hint_01;
  ulong uVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double in_XMM1_Qa;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double local_98;
  int curve_hint;
  undefined4 uStack_7c;
  double local_78;
  double local_70;
  undefined1 local_68 [16];
  double local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  iVar6 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
  if ((((int)uVar4 <= v_stride) && (0 < iVar6)) && (0 < (int)uVar4)) {
    if (hint == (int *)0x0) {
      hint_01 = 0;
    }
    else {
      hint_01 = *hint & 0x3fff;
    }
    iVar6 = iVar6 + 1;
    if ((this->m_t).m_count < 1) {
      pdVar5 = (double *)0x0;
    }
    else {
      pdVar5 = (this->m_t).m_a;
    }
    hint_00 = ON_NurbsSpanIndex(2,iVar6,pdVar5,t,side,hint_01);
    local_98 = t;
    if ((side == 2) || (side == -2)) {
      pdVar5 = (this->m_t).m_a;
      in_XMM1_Qa = pdVar5[(long)(int)hint_00 + 1];
      _curve_hint = t;
      bVar3 = ON_TuneupEvaluationParameter
                        (side,pdVar5[(int)hint_00],in_XMM1_Qa,(double *)&curve_hint);
      if (bVar3) {
        knot = (double *)0x0;
        if (0 < (this->m_t).m_count) {
          knot = pdVar5;
        }
        local_98 = _curve_hint;
        hint_00 = ON_NurbsSpanIndex(2,iVar6,knot,_curve_hint,side,hint_00);
      }
    }
    uVar7 = (ulong)(uint)side;
    pOVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[(int)hint_00];
    if (pOVar1 != (ON_Curve *)0x0) {
      (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar1);
      local_78 = in_XMM1_Qa;
      uStack_7c = extraout_XMM0_Db;
      dVar10 = ON_Interval::Min((ON_Interval *)&curve_hint);
      local_68._8_4_ = extraout_XMM0_Dc;
      local_68._0_8_ = dVar10;
      local_68._12_4_ = extraout_XMM0_Dd;
      dVar10 = ON_Interval::Max((ON_Interval *)&curve_hint);
      if (((double)local_68._0_8_ != dVar10) || (NAN((double)local_68._0_8_) || NAN(dVar10))) {
        pdVar5 = (this->m_t).m_a;
        local_58 = pdVar5[(int)hint_00];
        local_70 = pdVar5[(long)(int)hint_00 + 1];
        if (((double)local_68._0_8_ != local_58) ||
           (((NAN((double)local_68._0_8_) || NAN(local_58) || (dVar10 != local_70)) ||
            (NAN(dVar10) || NAN(local_70))))) {
          dVar9 = local_70 - local_58;
          if (ABS(local_58) * 2.220446049250313e-16 + 2.3283064365386963e-10 <= ABS(dVar9)) {
            auVar11._0_8_ = local_70 - local_98;
            auVar11._8_8_ = local_98 - local_58;
            auVar2._8_8_ = dVar9;
            auVar2._0_8_ = dVar9;
            auVar12 = divpd(auVar11,auVar2);
            if ((auVar12._0_8_ != 0.0) || (NAN(auVar12._0_8_))) {
              if ((auVar12._0_8_ != 1.0) || (NAN(auVar12._0_8_))) {
                if ((auVar12._8_8_ != 0.0) || (NAN(auVar12._8_8_))) {
                  if ((auVar12._8_8_ == 1.0) && (!NAN(auVar12._8_8_))) {
                    auVar12 = ZEXT816(0x3ff0000000000000) << 0x40;
                  }
                }
                else {
                  auVar12._0_8_ = 1.0;
                }
              }
              else {
                auVar12 = ZEXT816(0x3ff0000000000000);
              }
            }
            else {
              auVar12._8_8_ = 1.0;
            }
            local_98 = auVar12._0_8_ * (double)local_68._0_8_ + auVar12._8_8_ * dVar10;
          }
          else {
            uVar8 = -(ulong)(ABS(local_98 - local_58) < ABS(local_98 - local_70));
            local_98 = (double)(~uVar8 & (ulong)dVar10 | uVar8 & local_68._0_8_);
          }
          if (side == -1) {
            uVar7 = 0xfffffffffffffffe;
          }
          else if (side == 1) {
            uVar7 = 2;
          }
        }
        local_48._8_4_ = extraout_XMM0_Dc_00;
        local_48._0_8_ = dVar10;
        local_48._12_4_ = extraout_XMM0_Dd_00;
        uStack_50 = 0;
        iVar6 = 0;
        if ((hint != (int *)0x0) && (iVar6 = 0, hint_01 == hint_00)) {
          iVar6 = *hint >> 0xe;
        }
        _curve_hint = (double)CONCAT44(uStack_7c,iVar6);
        iVar6 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3b])
                          (SUB84(local_98,0),pOVar1,(ulong)(uint)der_count,(ulong)(uint)v_stride,v,
                           uVar7 & 0xffffffff);
        if ((char)iVar6 != '\0') {
          if (0 < der_count) {
            if ((local_58 != local_70) || (NAN(local_58) || NAN(local_70))) {
              dVar10 = (double)local_48._0_8_ - (double)local_68._0_8_;
              local_70 = local_70 - local_58;
              if ((dVar10 != local_70) || (NAN(dVar10) || NAN(local_70))) {
                pdVar5 = v + (uint)v_stride;
                dVar9 = dVar10 / local_70;
                for (iVar6 = 1; iVar6 != der_count + 1; iVar6 = iVar6 + 1) {
                  for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
                    pdVar5[uVar7] = pdVar5[uVar7] * dVar9;
                  }
                  dVar9 = dVar9 * (dVar10 / local_70);
                  pdVar5 = pdVar5 + (uint)v_stride;
                }
              }
            }
          }
          if (hint != (int *)0x0) {
            *hint = curve_hint << 0xe | hint_00;
            return true;
          }
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_PolyCurve::Evaluate( // returns false if unable to evaluate
       double t,       // evaluation parameter
       int der_count,  // number of derivatives (>=0)
       int v_stride,   // v[] array stride (>=Dimension())
       double* v,      // v[] array of length stride*(ndir+1)
       int side,       // optional - determines which side to evaluate from
                       //         0 = default
                       //      <  0 to evaluate from below, 
                       //      >  0 to evaluate from above
       int* hint       // optional - evaluation hint (int) used to speed
                       //            repeated evaluations
       ) const
{
  bool rc = false;
  const int count = Count();
  const int dim = Dimension();
  int segment_hint, curve_hint;
  if ( count > 0 && dim > 0 && dim <= v_stride ) 
  {
    segment_hint = (hint) ? (*hint & 0x3FFF) : 0;
    int segment_index = ON_NurbsSpanIndex(2,count+1,m_t,t,side,segment_hint);
    if ( -2 == side || 2 == side )
    {
      // 9 November 2010 Dale Lear - ON_TuneupEvaluationParameter fix
      //   When evaluation passes through ON_CurveProxy or ON_PolyCurve reparamterization
      //   and the original side parameter was -1 or +1, it is changed to -2 or +2
      //   to indicate that if t is numerically closed to an end parameter, then
      //   it should be tuned up to be at the end parameter.
      double a = t;
      if ( ON_TuneupEvaluationParameter( side, m_t[segment_index], m_t[segment_index+1], &a) )
      {
        // recalculate segment index
        t = a;
        segment_index = ON_NurbsSpanIndex(2,count+1,m_t,t,side,segment_index);
      }
    }
    const ON_Curve* c = m_segment[segment_index];
    if ( c ) {
      double s0, s1;
      {
        ON_Interval dom = c->Domain();
        s0 = dom.Min();
        s1 = dom.Max();
      }
      if ( s0 != s1 ) 
      {
        const double t0 = m_t[segment_index];
        const double t1 = m_t[segment_index+1];
        double s;
        if ( s0 == t0 && s1 == t1 )
        {
          // segment domain = c->Domain()
          s = t;
        }
        else 
        {
          // adjust segment domain parameter
          if ( fabs(t1 - t0) < (ON_ZERO_TOLERANCE + ON_EPSILON*fabs(t0)) )
          {
            // segment domain is insanely short
            s = (fabs(t-t0) < fabs(t-t1)) ? s0 : s1;
          }
          else 
          {
            // 30 May 2012 Dale Lear bug # 105974
            //   The arithmetic below was setting b = 0 and a = 0.9999999999999...
            //   so I added the checking for 0 and 1 stuff.
            const double d = t1-t0;
            double a = (t - t0)/d;
            double b = (t1 - t)/d;
            if ( 0.0 == b )
              a = 1.0;
            else if ( 1.0 == b )
              a = 0.0;
            else if ( 0.0 == a )
              b = 1.0;
            else if ( 1.0 == a )
              b = 0.0;
            s = b*s0 + a*s1;
          }
          if ( -1 == side )
            side = -2;
          else if ( 1 == side )
            side = 2;
        }
        curve_hint = ( hint && segment_hint == segment_index ) ? ((*hint)>>14) : 0;
        rc = c->Evaluate(
           s, 
           der_count, 
           v_stride, v, 
           side, 
           &curve_hint );

        if ( rc ) 
        {
          if ( der_count > 0 && s1 - s0 != t1 - t0 && t0 != t1 )
          {
            // Adjust segment derivative evaluation bug by applying chain rule
            // to get polycurve derivative value.
            const double d = (s1-s0)/(t1-t0);
            s = d;
            int di, vi;
            v += v_stride;
            for ( di = 1; di <= der_count; di++ )
            {
              for ( vi = 0; vi < dim; vi++ ) 
              {
                v[vi] = s*v[vi];
              }
              s *= d;
              v += v_stride;
            }
          }

          if ( hint )
            *hint = segment_index | (curve_hint<<14);
        }

      }
    }
  }
  return rc;
}